

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
toml::detail::
insert_nested_key<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,table_type *root,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          iter,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               last,region *key_reg,bool is_array_of_table)

{
  key_type *k;
  value_t vVar1;
  element_type *peVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  array_type *paVar8;
  reference pvVar9;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  table_type *ptVar10;
  syntax_error *psVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *pcVar13;
  __node_base *p_Var14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  key_curr;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *inserting;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_08;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_09;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_10;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_11;
  allocator_type local_449;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *local_448;
  allocator_type local_43a;
  allocator<char> local_439;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  syntax_error *local_358;
  region *local_350;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_348;
  value_type aot;
  undefined1 local_2e8 [8];
  pointer pbStack_2e0;
  _Alloc_hider local_2d8;
  source_location local_298;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  undefined1 local_148 [48];
  pointer local_118;
  region local_108;
  region local_c0;
  region local_78;
  
  local_448 = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)root;
  local_430._M_current = iter._M_current;
  local_350 = (region *)last._M_current;
  if (v == (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)iter._M_current)
  {
    __assert_fail("iter != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/parser.hpp"
                  ,0x601,
                  "result<bool, std::string> toml::detail::insert_nested_key(typename Value::table_type &, const Value &, InputIterator, const InputIterator, region, const bool) [Value = toml::basic_value<toml::discard_comments>, InputIterator = __gnu_cxx::__normal_iterator<const std::basic_string<char> *, std::vector<std::basic_string<char>>>]"
                 );
  }
  key_curr._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v;
  local_438._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v;
  while( true ) {
    sVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this,key_curr._M_current);
    inserting = local_448;
    if (key_curr._M_current + 1 == local_430._M_current) break;
    if (sVar6 == 0) {
      aot._0_8_ = &aot.region_info_;
      aot.field_1.integer_ = 1;
      aot.field_1.string_.str._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      aot.field_1.string_.str._M_string_length = 0;
      aot.field_1._24_8_ = 0x3f800000;
      aot.field_1._32_8_ = 0;
      aot.region_info_.super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      region::region(&local_c0,local_350);
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = 0;
      local_148._16_8_ = (pointer)0x0;
      v = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_148;
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
                ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)&local_248,
                 (table_type *)&aot,&local_c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)v);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,key_curr._M_current);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
                (pmVar7,(basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                        &local_248);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)&local_248)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      region::~region(&local_c0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&aot);
    }
    local_358 = (syntax_error *)(key_curr._M_current + 1);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,key_curr._M_current);
    vVar1 = pmVar7->type_;
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,key_curr._M_current);
    if (vVar1 == table) {
      peVar2 = (pmVar7->region_info_).
               super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar5 = (*peVar2->_vptr_region_base[3])(), (char)iVar5 == '{')) {
        local_358 = (syntax_error *)__cxa_allocate_exception(0x78);
        format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_408,(detail *)local_438._M_current,key_curr._M_current + 1,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )v);
        concat_to_string<char_const(&)[51],std::__cxx11::string,char_const(&)[34]>
                  (&local_3e8,(toml *)"toml::insert_value: inserting to an inline table (",
                   (char (*) [51])&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") but inline tables are immutable",(char (*) [34])iter._M_current);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)this,key_curr._M_current);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)&aot,pmVar7);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[28],_true>
                  (&local_248,(source_location *)&aot,(char (*) [28])0x1879da);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)local_2e8,local_448);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[15],_true>
                  (&local_1d8,(source_location *)local_2e8,(char (*) [15])"inserting this");
        __l_02._M_len = 2;
        __l_02._M_array = &local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_428,__l_02,(allocator_type *)&local_378);
        local_3a8._M_dataplus._M_p = (pointer)0x0;
        local_3a8._M_string_length = 0;
        local_3a8.field_2._M_allocated_capacity = 0;
        format_underline(&local_3c8,&local_3e8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_428,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_3a8,false);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  (&local_298,local_448);
        syntax_error::syntax_error(local_358,&local_3c8,&local_298);
        __cxa_throw(local_358,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,key_curr._M_current);
      key_curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
    }
    else {
      local_380 = key_curr._M_current;
      local_348 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this;
      if (pmVar7->type_ != array) {
        psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
        format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_408,(detail *)local_438._M_current,local_380 + 1,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )v);
        pcVar13 = ") is neither table nor an array of tables";
        concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[42]>
                  (&local_3e8,(toml *)"toml::insert_value: target (",(char (*) [29])&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") is neither table nor an array of tables",(char (*) [42])iter._M_current);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)local_348,local_380);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)&aot,pmVar7);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)local_348,local_380);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_168.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar7->type_);
        concat_to_string<char_const(&)[16],toml::value_t>
                  (&local_428,(toml *)0x187b4d,(char (*) [16])&local_168,(value_t *)pcVar13);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_248,(source_location *)&aot,&local_428);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)local_2e8,local_448);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[15],_true>
                  (&local_1d8,(source_location *)local_2e8,(char (*) [15])"inserting this");
        __l._M_len = 2;
        __l._M_array = &local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_3a8,__l,&local_449);
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_3c8,&local_3e8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_3a8,&local_378,false);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  (&local_298,local_448);
        syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
        __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,key_curr._M_current);
      paVar8 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
                         (pmVar7);
      key_curr._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
      pbVar3 = (paVar8->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar3[-1].type_ != table) {
        psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
        format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_408,(detail *)local_438._M_current,local_380 + 1,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )v);
        pcVar13 = ") is neither table nor an array of tables";
        concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[42]>
                  (&local_3e8,(toml *)"toml::insert_value: target (",(char (*) [29])&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") is neither table nor an array of tables",(char (*) [42])iter._M_current);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)&aot,
                   (paVar8->
                   super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_168.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               (paVar8->
                               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish[-1].type_);
        concat_to_string<char_const(&)[16],toml::value_t>
                  (&local_428,(toml *)0x187b4d,(char (*) [16])&local_168,(value_t *)pcVar13);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_248,(source_location *)&aot,&local_428);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)local_2e8,local_448);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[15],_true>
                  (&local_1d8,(source_location *)local_2e8,(char (*) [15])"inserting this");
        __l_00._M_len = 2;
        __l_00._M_array = &local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_3a8,__l_00,&local_449);
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_3c8,&local_3e8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_3a8,&local_378,false);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  (&local_298,local_448);
        syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
        __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      if ((paVar8->
          super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar3) {
        psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
        format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_408,(detail *)local_438._M_current,local_430,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )v);
        concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[33]>
                  (&local_3e8,(toml *)"toml::insert_value: table (\"",(char (*) [29])&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\") conflicts with existing value",(char (*) [33])iter._M_current);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)local_348,local_380);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)&aot,pmVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"this array is not insertable",(allocator<char> *)&local_449
                  );
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_248,(source_location *)&aot,&local_428);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)local_2e8,local_448);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"appending it to the statically sized array",&local_439);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_1d8,(source_location *)local_2e8,&local_3a8);
        __l_01._M_len = 2;
        __l_01._M_array = &local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_378,__l_01,&local_43a);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_3c8,&local_3e8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_378,&local_168,false);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  (&local_298,local_448);
        syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
        __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      pvVar9 = std::
               vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               ::at(paVar8,0);
      peVar2 = (pvVar9->region_info_).
               super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        (*peVar2->_vptr_region_base[4])(&aot);
        v = (pointer)0x2;
        std::__cxx11::string::substr((ulong)&local_248,(ulong)&aot);
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_248,"[[");
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&aot);
        if (bVar4) {
          psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_408,(detail *)local_438._M_current,local_430,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[31],std::__cxx11::string,char_const(&)[60]>
                    (&local_3e8,(toml *)"toml::insert_value: a table (\"",(char (*) [31])&local_408,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") cannot be inserted to an existing inline array-of-tables",
                     (char (*) [60])iter._M_current);
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_348,local_380);
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                    ((source_location *)&aot,pmVar7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"this array of table has a static size",
                     (allocator<char> *)&local_449);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_248,(source_location *)&aot,&local_428);
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                    ((source_location *)local_2e8,local_448);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"appending it to the statically sized array",&local_439);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_1d8,(source_location *)local_2e8,&local_3a8);
          __l_03._M_len = 2;
          __l_03._M_array = &local_248;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_378,__l_03,&local_43a);
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_3c8,&local_3e8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_378,&local_168,false);
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                    (&local_298,local_448);
          syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
          __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
      }
      pmVar7 = (paVar8->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    this = (detail *)
           basic_value<toml::discard_comments,std::unordered_map,std::vector>::as_table_abi_cxx11_
                     ((basic_value<toml::discard_comments,std::unordered_map,std::vector> *)pmVar7);
  }
  if ((char)key_reg == '\0') {
    if (sVar6 == 1) {
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      if (pmVar7->type_ == table) {
        if (inserting->type_ == table) {
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,key_curr._M_current);
          _Var12._M_current = key_curr._M_current;
          args_2._M_current = local_430._M_current;
          bVar4 = is_valid_forward_table_definition<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (pmVar7,inserting,local_438,key_curr,local_430);
          if (!bVar4) {
            psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_408,(detail *)local_438._M_current,local_430,_Var12);
            concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                      (&local_3e8,(toml *)"toml::insert_value: table (\"",(char (*) [29])&local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") already exists.",(char (*) [19])args_2._M_current);
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,key_curr._M_current);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      ((source_location *)&aot,pmVar7);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[26],_true>
                      (&local_248,(source_location *)&aot,(char (*) [26])"table already exists here"
                      );
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      ((source_location *)local_2e8,local_448);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[20],_true>
                      (&local_1d8,(source_location *)local_2e8,(char (*) [20])"table defined twice")
            ;
            __l_10._M_len = 2;
            __l_10._M_array = &local_248;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_428,__l_10,(allocator_type *)&local_378);
            local_3a8._M_dataplus._M_p = (pointer)0x0;
            local_3a8._M_string_length = 0;
            local_3a8.field_2._M_allocated_capacity = 0;
            format_underline(&local_3c8,&local_3e8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_428,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_3a8,false);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      (&local_298,local_448);
            syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
            __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,key_curr._M_current);
          this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)basic_value<toml::discard_comments,std::unordered_map,std::vector>::
                       as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                            *)pmVar7);
          ptVar10 = basic_value<toml::discard_comments,std::unordered_map,std::vector>::
                    as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                         *)inserting);
          p_Var14 = &(ptVar10->_M_h)._M_before_begin;
          while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
            k = (key_type *)(p_Var14 + 1);
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,key_curr._M_current);
            bVar4 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::contains
                              (pmVar7,k);
            if (bVar4) {
              psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
              format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (&local_408,(detail *)local_438._M_current,local_430,_Var12);
              concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                        (&local_3e8,(toml *)"toml::insert_value: value (\"",
                         (char (*) [29])&local_408,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\") already exists.",(char (*) [19])args_2._M_current);
              pmVar7 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::at(this_00,k);
              basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                        ((source_location *)&aot,pmVar7);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[20],_true>
                        (&local_248,(source_location *)&aot,(char (*) [20])0x1878a6);
              basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                        ((source_location *)local_2e8,local_448);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[19],_true>
                        (&local_1d8,(source_location *)local_2e8,(char (*) [19])"this defined twice"
                        );
              __l_04._M_len = 2;
              __l_04._M_array = &local_248;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_428,__l_04,(allocator_type *)&local_378);
              local_3a8._M_dataplus._M_p = (pointer)0x0;
              local_3a8._M_string_length = 0;
              local_3a8.field_2._M_allocated_capacity = 0;
              format_underline(&local_3c8,&local_3e8,
                               (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_428,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_3a8,false);
              basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                        (&local_298,local_448);
              syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
              __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
            }
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](this_00,k);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
                      (pmVar7,(basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                               *)(p_Var14 + 5));
          }
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,key_curr._M_current);
          region::region(&local_78,local_350);
          change_region<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                    (pmVar7,&local_78);
          region::~region(&local_78);
          goto LAB_0011b4ff;
        }
      }
      else if ((inserting->type_ == table) &&
              (pmVar7 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this,key_curr._M_current), pmVar7->type_ == array)) {
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)this,key_curr._M_current);
        paVar8 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
                           (pmVar7);
        v = (paVar8->
            super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
        if (v != (paVar8->
                 super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) {
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,key_curr._M_current);
          paVar8 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
                             (pmVar7);
          if (((paVar8->
               super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->type_ == table) {
            psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_408,(detail *)local_438._M_current,local_430,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )v);
            concat_to_string<char_const(&)[39],std::__cxx11::string,char_const(&)[19]>
                      (&local_3e8,(toml *)"toml::insert_value: array of tables (\"",
                       (char (*) [39])&local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") already exists.",(char (*) [19])iter._M_current);
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,key_curr._M_current);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      ((source_location *)&aot,pmVar7);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[29],_true>
                      (&local_248,(source_location *)&aot,
                       (char (*) [29])"array of tables defined here");
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      ((source_location *)local_2e8,local_448);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[49],_true>
                      (&local_1d8,(source_location *)local_2e8,
                       (char (*) [49])"table conflicts with the previous array of table");
            __l_07._M_len = 2;
            __l_07._M_array = &local_248;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_428,__l_07,(allocator_type *)&local_378);
            local_3a8._M_dataplus._M_p = (pointer)0x0;
            local_3a8._M_string_length = 0;
            local_3a8.field_2._M_allocated_capacity = 0;
            format_underline(&local_3c8,&local_3e8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_428,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_3a8,false);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                      (&local_298,local_448);
            syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
            __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
        }
      }
      psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
      format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_408,(detail *)local_438._M_current,local_430,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )v);
      concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                (&local_3e8,(toml *)"toml::insert_value: value (\"",(char (*) [29])&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\") already exists.",(char (*) [19])iter._M_current);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)&aot,pmVar7);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[26],_true>
                (&local_248,(source_location *)&aot,(char (*) [26])"value already exists here");
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)local_2e8,local_448);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[20],_true>
                (&local_1d8,(source_location *)local_2e8,(char (*) [20])"value defined twice");
      __l_08._M_len = 2;
      __l_08._M_array = &local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_428,__l_08,(allocator_type *)&local_378);
      local_3a8._M_dataplus._M_p = (pointer)0x0;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity = 0;
      format_underline(&local_3c8,&local_3e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_428,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_3a8,false);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                (&local_298,local_448);
      syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
      __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                *)&local_248,key_curr._M_current,local_448);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this,&local_248);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
             *)&local_248);
  }
  else {
    if (sVar6 != 1) {
      local_2e8 = (undefined1  [8])0x0;
      pbStack_2e0 = (pointer)0x0;
      local_2d8._M_p = (pointer)0x0;
      region::str_abi_cxx11_((string *)&aot,local_350);
      std::__cxx11::string::substr((ulong)&local_248,(ulong)&aot);
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_248,"[[");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&aot);
      if (bVar4) {
        region::comments_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248,local_350);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2e8,&local_248);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_248);
      }
      std::
      vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
      ::vector((vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                *)&local_248,1,inserting,(allocator_type *)&local_298);
      region::region(&local_108,local_350);
      local_148._32_8_ = local_2e8;
      local_148._40_8_ = pbStack_2e0;
      local_118 = (pointer)local_2d8._M_p;
      local_2e8 = (undefined1  [8])0x0;
      pbStack_2e0 = (pointer)0x0;
      local_2d8._M_p = (pointer)0x0;
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
                (&aot,(array_type *)&local_248,&local_108,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_148 + 0x20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_148 + 0x20));
      region::~region(&local_108);
      std::
      vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
      ::~vector((vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                 *)&local_248);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
      ::pair<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                  *)&local_248,key_curr._M_current,&aot);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,&local_248);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
               *)&local_248);
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value = true;
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value(&aot);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2e8);
      return __return_storage_ptr__;
    }
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,key_curr._M_current);
    if (pmVar7->type_ == table) {
      psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
      format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_408,(detail *)local_438._M_current,local_430,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )v);
      concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[21]>
                (&local_3e8,(toml *)"toml::insert_value: array of table (\"",
                 (char (*) [38])&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\") cannot be defined",(char (*) [21])iter._M_current);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)&aot,pmVar7);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[22],_true>
                (&local_248,(source_location *)&aot,(char (*) [22])"table already defined");
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)local_2e8,local_448);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[39],_true>
                (&local_1d8,(source_location *)local_2e8,
                 (char (*) [39])"this conflicts with the previous table");
      __l_06._M_len = 2;
      __l_06._M_array = &local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_428,__l_06,(allocator_type *)&local_378);
      local_3a8._M_dataplus._M_p = (pointer)0x0;
      local_3a8._M_string_length = 0;
      local_3a8.field_2._M_allocated_capacity = 0;
      format_underline(&local_3c8,&local_3e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_428,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_3a8,false);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                (&local_298,local_448);
      syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
      __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,key_curr._M_current);
    if (pmVar7->type_ != array) {
      psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
      format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_408,(detail *)local_438._M_current,local_430,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )v);
      concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[32]>
                (&local_3e8,(toml *)"toml::insert_value: array of table (\"",
                 (char (*) [38])&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\") collides with existing value",(char (*) [32])iter._M_current);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)&aot,pmVar7);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_168.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar7->type_);
      concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[22]>
                (&local_428,(toml *)"this ",(char (*) [6])&local_168,
                 (value_t *)" value already exists",(char (*) [22])iter._M_current);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_248,(source_location *)&aot,&local_428);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)local_2e8,local_448);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[37],_true>
                (&local_1d8,(source_location *)local_2e8,
                 (char (*) [37])"while inserting this array-of-tables");
      __l_09._M_len = 2;
      __l_09._M_array = &local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_3a8,__l_09,&local_449);
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_3c8,&local_3e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_3a8,&local_378,false);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                (&local_298,local_448);
      syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
      __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,key_curr._M_current);
    paVar8 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array(pmVar7);
    pbVar3 = (paVar8->
             super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pbVar3 == (paVar8->
                   super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) || (pbVar3->type_ != table)) {
      psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
      format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_408,(detail *)local_438._M_current,local_430,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )v);
      concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[32]>
                (&local_3e8,(toml *)"toml::insert_value: array of table (\"",
                 (char (*) [38])&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\") collides with existing value",(char (*) [32])iter._M_current);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)&aot,pmVar7);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,key_curr._M_current);
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_168.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar7->type_);
      concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[22]>
                (&local_428,(toml *)"this ",(char (*) [6])&local_168,
                 (value_t *)" value already exists",(char (*) [22])iter._M_current);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_248,(source_location *)&aot,&local_428);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                ((source_location *)local_2e8,local_448);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[37],_true>
                (&local_1d8,(source_location *)local_2e8,
                 (char (*) [37])"while inserting this array-of-tables");
      __l_05._M_len = 2;
      __l_05._M_array = &local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_3a8,__l_05,&local_449);
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_3c8,&local_3e8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_3a8,&local_378,false);
      basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                (&local_298,local_448);
      syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
      __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    peVar2 = (pbVar3->region_info_).
             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      (*peVar2->_vptr_region_base[4])(&aot);
      _Var12._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      std::__cxx11::string::substr((ulong)&local_248,(ulong)&aot);
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_248,"[[");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&aot);
      inserting = local_448;
      if (bVar4) {
        psVar11 = (syntax_error *)__cxa_allocate_exception(0x78);
        format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&local_408,(detail *)local_438._M_current,local_430,_Var12);
        concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[42]>
                  (&local_3e8,(toml *)"toml::insert_value: array of table (\"",
                   (char (*) [38])&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\") collides with existing array-of-tables",(char (*) [42])iter._M_current);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)this,key_curr._M_current);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)&aot,pmVar7);
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)this,key_curr._M_current);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_168.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar7->type_);
        concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[23]>
                  (&local_428,(toml *)"this ",(char (*) [6])&local_168,
                   (value_t *)" value has static size",(char (*) [23])iter._M_current);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_248,(source_location *)&aot,&local_428);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  ((source_location *)local_2e8,local_448);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[43],_true>
                  (&local_1d8,(source_location *)local_2e8,
                   (char (*) [43])"appending it to the statically sized array");
        __l_11._M_len = 2;
        __l_11._M_array = &local_248;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_3a8,__l_11,&local_449);
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_3c8,&local_3e8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_3a8,&local_378,false);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location
                  (&local_298,local_448);
        syntax_error::syntax_error(psVar11,&local_3c8,&local_298);
        __cxa_throw(psVar11,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
    }
    std::
    vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
    ::push_back(paVar8,inserting);
  }
LAB_0011b4ff:
  __return_storage_ptr__->is_ok_ = true;
  (__return_storage_ptr__->field_1).succ.value = true;
  return __return_storage_ptr__;
}

Assistant:

result<bool, std::string>
insert_nested_key(typename Value::table_type& root, const Value& v,
                  InputIterator iter, const InputIterator last,
                  region key_reg,
                  const bool is_array_of_table = false)
{
    static_assert(std::is_same<key,
        typename std::iterator_traits<InputIterator>::value_type>::value,"");

    using value_type = Value;
    using table_type = typename value_type::table_type;
    using array_type = typename value_type::array_type;

    const auto first = iter;
    assert(iter != last);

    table_type* tab = std::addressof(root);
    for(; iter != last; ++iter) // search recursively
    {
        const key& k = *iter;
        if(std::next(iter) == last) // k is the last key
        {
            // XXX if the value is array-of-tables, there can be several
            //     tables that are in the same array. in that case, we need to
            //     find the last element and insert it to there.
            if(is_array_of_table)
            {
                if(tab->count(k) == 1) // there is already an array of table
                {
                    if(tab->at(k).is_table())
                    {
                        // show special err msg for conflicting table
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last),
                            "\") cannot be defined"), {
                                {tab->at(k).location(), "table already defined"},
                                {v.location(), "this conflicts with the previous table"}
                            }), v.location());
                    }
                    else if(!(tab->at(k).is_array()))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last), "\") collides with"
                            " existing value"), {
                                {tab->at(k).location(),
                                 concat_to_string("this ", tab->at(k).type(),
                                                  " value already exists")},
                                {v.location(),
                                 "while inserting this array-of-tables"}
                            }), v.location());
                    }
                    // the above if-else-if checks tab->at(k) is an array
                    auto& a = tab->at(k).as_array();
                    // If table element is defined as [[array_of_tables]], it
                    // cannot be an empty array. If an array of tables is
                    // defined as `aot = []`, it cannot be appended.
                    if(a.empty() || !(a.front().is_table()))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last), "\") collides with"
                            " existing value"), {
                                {tab->at(k).location(),
                                 concat_to_string("this ", tab->at(k).type(),
                                                  " value already exists")},
                                {v.location(),
                                 "while inserting this array-of-tables"}
                            }), v.location());
                    }
                    // avoid conflicting array of table like the following.
                    // ```toml
                    // a = [{b = 42}] # define a as an array of *inline* tables
                    // [[a]]          # a is an array of *multi-line* tables
                    // b = 54
                    // ```
                    // Here, from the type information, these cannot be detected
                    // because inline table is also a table.
                    // But toml v0.5.0 explicitly says it is invalid. The above
                    // array-of-tables has a static size and appending to the
                    // array is invalid.
                    // In this library, multi-line table value has a region
                    // that points to the key of the table (e.g. [[a]]). By
                    // comparing the first two letters in key, we can detect
                    // the array-of-table is inline or multiline.
                    if(const auto ptr = detail::get_region(a.front()))
                    {
                        if(ptr->str().substr(0,2) != "[[")
                        {
                            throw syntax_error(format_underline(concat_to_string(
                                "toml::insert_value: array of table (\"",
                                format_dotted_keys(first, last), "\") collides "
                                "with existing array-of-tables"), {
                                    {tab->at(k).location(),
                                     concat_to_string("this ", tab->at(k).type(),
                                                      " value has static size")},
                                    {v.location(),
                                     "appending it to the statically sized array"}
                                }), v.location());
                        }
                    }
                    a.push_back(v);
                    return ok(true);
                }
                else // if not, we need to create the array of table
                {
                    // XXX: Consider the following array of tables.
                    // ```toml
                    // # This is a comment.
                    // [[aot]]
                    // foo = "bar"
                    // ```
                    // Here, the comment is for `aot`. But here, actually two
                    // values are defined. An array that contains tables, named
                    // `aot`, and the 0th element of the `aot`, `{foo = "bar"}`.
                    // Those two are different from each other. But both of them
                    // points to the same portion of the TOML file, `[[aot]]`,
                    // so `key_reg.comments()` returns `# This is a comment`.
                    // If it is assigned as a comment of `aot` defined here, the
                    // comment will be duplicated. Both the `aot` itself and
                    // the 0-th element will have the same comment. This causes
                    // "duplication of the same comments" bug when the data is
                    // serialized.
                    //     Next, consider the following.
                    // ```toml
                    // # comment 1
                    // aot = [
                    //     # comment 2
                    //     {foo = "bar"},
                    // ]
                    // ```
                    // In this case, we can distinguish those two comments. So
                    // here we need to add "comment 1" to the `aot` and
                    // "comment 2" to the 0th element of that.
                    //     To distinguish those two, we check the key region.
                    std::vector<std::string> comments{/* empty by default */};
                    if(key_reg.str().substr(0, 2) != "[[")
                    {
                        comments = key_reg.comments();
                    }
                    value_type aot(array_type(1, v), key_reg, std::move(comments));
                    tab->insert(std::make_pair(k, aot));
                    return ok(true);
                }
            } // end if(array of table)

            if(tab->count(k) == 1)
            {
                if(tab->at(k).is_table() && v.is_table())
                {
                    if(!is_valid_forward_table_definition(
                                tab->at(k), v, first, iter, last))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: table (\"",
                            format_dotted_keys(first, last),
                            "\") already exists."), {
                                {tab->at(k).location(), "table already exists here"},
                                {v.location(), "table defined twice"}
                            }), v.location());
                    }
                    // to allow the following toml file.
                    // [a.b.c]
                    // d = 42
                    // [a]
                    // e = 2.71
                    auto& t = tab->at(k).as_table();
                    for(const auto& kv : v.as_table())
                    {
                        if(tab->at(k).contains(kv.first))
                        {
                            throw syntax_error(format_underline(concat_to_string(
                                "toml::insert_value: value (\"",
                                format_dotted_keys(first, last),
                                "\") already exists."), {
                                    {t.at(kv.first).location(), "already exists here"},
                                    {v.location(), "this defined twice"}
                                }), v.location());
                        }
                        t[kv.first] = kv.second;
                    }
                    detail::change_region(tab->at(k), key_reg);
                    return ok(true);
                }
                else if(v.is_table()                     &&
                        tab->at(k).is_array()            &&
                        tab->at(k).as_array().size() > 0 &&
                        tab->at(k).as_array().front().is_table())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: array of tables (\"",
                        format_dotted_keys(first, last), "\") already exists."), {
                            {tab->at(k).location(), "array of tables defined here"},
                            {v.location(), "table conflicts with the previous array of table"}
                        }), v.location());
                }
                else
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: value (\"",
                        format_dotted_keys(first, last), "\") already exists."), {
                            {tab->at(k).location(), "value already exists here"},
                            {v.location(), "value defined twice"}
                        }), v.location());
                }
            }
            tab->insert(std::make_pair(k, v));
            return ok(true);
        }
        else // k is not the last one, we should insert recursively
        {
            // if there is no corresponding value, insert it first.
            // related: you don't need to write
            // # [x]
            // # [x.y]
            // to write
            // [x.y.z]
            if(tab->count(k) == 0)
            {
                // a table that is defined implicitly doesn't have any comments.
                (*tab)[k] = value_type(table_type{}, key_reg, {/*no comment*/});
            }

            // type checking...
            if(tab->at(k).is_table())
            {
                // According to toml-lang/toml:36d3091b3 "Clarify that inline
                // tables are immutable", check if it adds key-value pair to an
                // inline table.
                if(const auto* ptr = get_region(tab->at(k)))
                {
                    // here, if the value is a (multi-line) table, the region
                    // should be something like `[table-name]`.
                    if(ptr->front() == '{')
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: inserting to an inline table (",
                            format_dotted_keys(first, std::next(iter)),
                            ") but inline tables are immutable"), {
                                {tab->at(k).location(), "inline tables are immutable"},
                                {v.location(), "inserting this"}
                            }), v.location());
                    }
                }
                tab = std::addressof((*tab)[k].as_table());
            }
            else if(tab->at(k).is_array()) // inserting to array-of-tables?
            {
                auto& a = (*tab)[k].as_array();
                if(!a.back().is_table())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: target (",
                        format_dotted_keys(first, std::next(iter)),
                        ") is neither table nor an array of tables"), {
                            {a.back().location(), concat_to_string(
                                    "actual type is ", a.back().type())},
                            {v.location(), "inserting this"}
                        }), v.location());
                }
                if(a.empty())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: table (\"",
                        format_dotted_keys(first, last), "\") conflicts with"
                        " existing value"), {
                            {tab->at(k).location(), std::string("this array is not insertable")},
                            {v.location(), std::string("appending it to the statically sized array")}
                        }), v.location());
                }
                if(const auto ptr = detail::get_region(a.at(0)))
                {
                    if(ptr->str().substr(0,2) != "[[")
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: a table (\"",
                            format_dotted_keys(first, last), "\") cannot be "
                            "inserted to an existing inline array-of-tables"), {
                                {tab->at(k).location(), std::string("this array of table has a static size")},
                                {v.location(), std::string("appending it to the statically sized array")}
                            }), v.location());
                    }
                }
                tab = std::addressof(a.back().as_table());
            }
            else
            {
                throw syntax_error(format_underline(concat_to_string(
                    "toml::insert_value: target (",
                    format_dotted_keys(first, std::next(iter)),
                    ") is neither table nor an array of tables"), {
                        {tab->at(k).location(), concat_to_string(
                                "actual type is ", tab->at(k).type())},
                        {v.location(), "inserting this"}
                    }), v.location());
            }
        }
    }
    return err(std::string("toml::detail::insert_nested_key: never reach here"));
}